

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_image_dds.cxx
# Opt level: O0

bool __thiscall xray_re::xr_image::load_dds(xr_image *this,string *path)

{
  bool bVar1;
  uint uVar2;
  char *name;
  rgba32 *prVar3;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d8d_for_Color32_0_0 *paVar4;
  Color32 *pix;
  undefined1 local_f8 [4];
  uint i;
  Image image;
  undefined1 local_d0 [8];
  DirectDrawSurface dds;
  string *path_local;
  xr_image *this_local;
  
  dds.header10._12_8_ = path;
  name = (char *)std::__cxx11::string::c_str();
  nv::DirectDrawSurface::DirectDrawSurface((DirectDrawSurface *)local_d0,name);
  bVar1 = nv::DirectDrawSurface::isValid((DirectDrawSurface *)local_d0);
  if ((bVar1) && (bVar1 = nv::DirectDrawSurface::isTexture2D((DirectDrawSurface *)local_d0), bVar1))
  {
    nv::Image::Image((Image *)local_f8);
    nv::DirectDrawSurface::mipmap((DirectDrawSurface *)local_d0,(Image *)local_f8,0,0);
    uVar2 = nv::Image::width((Image *)local_f8);
    this->m_width = uVar2;
    uVar2 = nv::Image::height((Image *)local_f8);
    this->m_height = uVar2;
    prVar3 = (rgba32 *)operator_new__((ulong)(this->m_width * this->m_height) << 2);
    this->m_data = prVar3;
    pix._4_4_ = this->m_height * this->m_width;
    while (pix._4_4_ != 0) {
      pix._4_4_ = pix._4_4_ - 1;
      paVar4 = (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d8d_for_Color32_0_0 *)
               nv::Image::pixel((Image *)local_f8,pix._4_4_);
      ((anon_union_4_2_12391d8d_for_Color32_0 *)(this->m_data + pix._4_4_))->field_0 = *paVar4;
    }
    this_local._7_1_ = true;
    image.m_data._0_4_ = 1;
    nv::Image::~Image((Image *)local_f8);
  }
  else {
    this_local._7_1_ = false;
    image.m_data._0_4_ = 1;
  }
  nv::DirectDrawSurface::~DirectDrawSurface((DirectDrawSurface *)local_d0);
  return this_local._7_1_;
}

Assistant:

bool xr_image::load_dds(const std::string& path)
{
	nv::DirectDrawSurface dds(path.c_str());
	if (!dds.isValid() || !dds.isTexture2D())
		return false;
	nv::Image image;
	dds.mipmap(&image, 0, 0);
	m_width = image.width();
	m_height = image.height();
	m_data = new rgba32[m_width*m_height];
	for (unsigned i = m_height*m_width; i > 0;) {
		const nv::Color32& pix = image.pixel(--i);
		m_data[i] = pix.u;
	}
	return true;
}